

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
cmELFInternalImpl<cmELFTypes32>::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          cmELFInternalImpl<cmELFTypes32> *this,DynamicEntryList *entries)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer ppVar3;
  ushort uVar4;
  ushort uVar5;
  undefined5 uVar6;
  undefined8 uVar7;
  undefined1 uVar8;
  pair<long,_unsigned_long> *entry;
  pointer ppVar9;
  ELF_Dyn dyn;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 1);
  ppVar9 = (entries->
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (entries->
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar9 != ppVar3) {
    do {
      uVar1 = (undefined4)ppVar9->first;
      uVar2 = (undefined4)ppVar9->second;
      local_38 = CONCAT44(uVar2,uVar1);
      if ((this->super_cmELFInternal).NeedSwap == true) {
        local_38._0_1_ = (undefined1)uVar1;
        local_38._3_1_ = (undefined1)((uint)uVar1 >> 0x18);
        uVar6 = CONCAT41(uVar2,(undefined1)local_38);
        local_38._1_2_ = (ushort)((uint)uVar1 >> 8);
        uVar4 = local_38._1_2_ << 8;
        uVar5 = local_38._1_2_ >> 8;
        local_38 = CONCAT53(uVar6,CONCAT21(uVar4 | uVar5,local_38._3_1_));
        uVar7 = local_38;
        local_38._4_1_ = (undefined1)uVar2;
        uVar8 = local_38._4_1_;
        local_38._7_1_ = (undefined1)((uint)uVar2 >> 0x18);
        local_38._5_2_ = (ushort)((uint)uVar2 >> 8);
        uVar4 = local_38._5_2_ << 8;
        uVar5 = local_38._5_2_ >> 8;
        local_38 = CONCAT17(uVar8,CONCAT25(uVar4 | uVar5,CONCAT14(local_38._7_1_,(int)uVar7)));
      }
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&local_38,&stack0xffffffffffffffd0);
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> cmELFInternalImpl<Types>::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& entries)
{
  std::vector<char> result;
  result.reserve(sizeof(ELF_Dyn) * entries.size());

  for (auto const& entry : entries) {
    // Store the entry in an ELF_Dyn, byteswap it, then serialize to chars
    ELF_Dyn dyn;
    dyn.d_tag = static_cast<tagtype>(entry.first);
    dyn.d_un.d_val = static_cast<tagtype>(entry.second);

    if (this->NeedSwap) {
      this->ByteSwap(dyn);
    }

    char* pdyn = reinterpret_cast<char*>(&dyn);
    cm::append(result, pdyn, pdyn + sizeof(ELF_Dyn));
  }

  return result;
}